

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTestSuite<NoiseModelUpdateTest,_testing::internal::Templates<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForWhiteRandomNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForScaledWhiteNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForCorrelatedNoise,_gtest_suite_NoiseModelUpdateTest_::NoiseStrengthChangeSignalsDifferentNoiseType,_gtest_suite_NoiseModelUpdateTest_::NoiseCoeffsSignalsDifferentNoiseType>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TypedTestSuitePState *in_RCX;
  CodeLocation *in_RDX;
  char *in_RSI;
  char *in_R8;
  char *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  int in_stack_00000074;
  char *in_stack_00000078;
  char *in_stack_00000080;
  CodeLocation *in_stack_00000088;
  CodeLocation *test_location;
  string test_name;
  CodeLocation *in_stack_fffffffffffffec8;
  TypedTestSuitePState *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffef8;
  string *this;
  TypedTestSuitePState *in_stack_ffffffffffffff00;
  FILE *__stream;
  string *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  string local_a0 [36];
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  RegisterTypeParameterizedTestSuiteInstantiation((char *)0x5c40e9);
  GetPrefixUntilComma_abi_cxx11_
            ((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  StripTrailingSpaces(in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_70);
  bVar1 = TypedTestSuitePState::TestExists
                    (in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->file);
  if (!bVar1) {
    __stream = _stderr;
    uVar2 = std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    FormatFileLocation_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    this = local_a0;
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"Failed to get code location for test %s.%s at %s.",in_RCX,uVar2,uVar3);
    std::__cxx11::string::~string(this);
    fflush(_stderr);
    posix::Abort();
  }
  TypedTestSuitePState::GetCodeLocation(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  TypeParameterizedTest<NoiseModelUpdateTest,_testing::internal::TemplateSel<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
  ::Register((char *)test_location,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000074,in_stack_00000068);
  CodeLocation::CodeLocation((CodeLocation *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SkipComma((char *)in_stack_fffffffffffffec8);
  bVar1 = TypeParameterizedTestSuite<NoiseModelUpdateTest,_testing::internal::Templates<gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForWhiteRandomNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForScaledWhiteNoise,_gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForCorrelatedNoise,_gtest_suite_NoiseModelUpdateTest_::NoiseStrengthChangeSignalsDifferentNoiseType,_gtest_suite_NoiseModelUpdateTest_::NoiseCoeffsSignalsDifferentNoiseType>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
          ::Register(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  CodeLocation::~CodeLocation((CodeLocation *)0x5c4304);
  std::__cxx11::string::~string(local_50);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }